

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_LoadSound3D(sfxinfo_t *sfx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  sfxinfo_t *psVar5;
  BYTE *sfxdata_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pair<SoundHandle,_bool> pVar6;
  pair<SoundHandle,_bool> local_f0;
  void *local_e0;
  pair<SoundHandle,_bool> local_d0;
  uint local_bc;
  void *pvStack_b8;
  int frequency;
  pair<SoundHandle,_bool> local_a8;
  void *local_98;
  undefined1 local_90;
  pair<SoundHandle,_bool> local_88;
  undefined1 local_78 [8];
  pair<SoundHandle,_bool> snd;
  SDWORD dmxlen;
  BYTE *sfxdata;
  FWadLump wlump;
  int size;
  sfxinfo_t *sfx_local;
  
  uVar2 = (*GSnd->_vptr_SoundRenderer[2])();
  if (((uVar2 & 1) == 0) && (bVar1 = SoundHandle::isValid(&sfx->data3d), !bVar1)) {
    pcVar4 = FString::GetChars(&sfx->name);
    psVar5 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,0);
    DPrintf(3,"Loading monoized sound \"%s\" (%td)\n",pcVar4,((long)sfx - (long)psVar5) / 0x50);
    wlump.Lump._4_4_ = FWadCollection::LumpLength(&Wads,sfx->lumpnum);
    if (0 < (int)wlump.Lump._4_4_) {
      FWadCollection::OpenLumpNum((FWadLump *)&sfxdata,&Wads,sfx->lumpnum);
      sfxdata_00 = (BYTE *)operator_new__((long)(int)wlump.Lump._4_4_);
      FWadLump::Read((FWadLump *)&sfxdata,sfxdata_00,(long)(int)wlump.Lump._4_4_);
      snd.second = (bool)sfxdata_00[4];
      snd._9_1_ = sfxdata_00[5];
      snd._10_1_ = sfxdata_00[6];
      snd._11_1_ = sfxdata_00[7];
      std::pair<SoundHandle,_bool>::pair<SoundHandle,_bool,_true>
                ((pair<SoundHandle,_bool> *)local_78);
      iVar3 = strncmp((char *)sfxdata_00,"Creative Voice File",0x13);
      if (iVar3 == 0) {
        pVar6 = SoundRenderer::LoadSoundVoc(GSnd,sfxdata_00,wlump.Lump._4_4_,true);
        local_98 = (void *)pVar6.first.data;
        local_90 = pVar6.second;
        local_88.first.data = local_98;
        local_88.second = (bool)local_90;
        std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_78,&local_88);
      }
      else if ((*(ushort *)&sfx->field_0x30 >> 2 & 1) == 0) {
        if (((*sfxdata_00 == '\x03') && (sfxdata_00[1] == '\0')) &&
           ((int)snd._8_4_ <= (int)(wlump.Lump._4_4_ - 8))) {
          local_bc = (uint)*(ushort *)(sfxdata_00 + 2);
          if (local_bc == 0) {
            local_bc = 0x2b11;
          }
          iVar3 = (*GSnd->_vptr_SoundRenderer[6])
                            (GSnd,sfxdata_00 + 8,(ulong)(uint)snd._8_4_,(ulong)local_bc,1,8,
                             sfx->LoopStart,0xffffffff,1);
          local_e0 = (void *)CONCAT44(extraout_var_00,iVar3);
          local_d0.first.data = local_e0;
          std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_78,&local_d0);
        }
        else {
          iVar3 = (*GSnd->_vptr_SoundRenderer[5])(GSnd,sfxdata_00,(ulong)wlump.Lump._4_4_,1);
          local_f0.first.data = (void *)CONCAT44(extraout_var_01,iVar3);
          std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_78,&local_f0);
        }
      }
      else {
        iVar3 = (*GSnd->_vptr_SoundRenderer[6])
                          (GSnd,sfxdata_00,(ulong)wlump.Lump._4_4_,(ulong)sfx->RawRate,1,8,
                           sfx->LoopStart,1,0);
        pvStack_b8 = (void *)CONCAT44(extraout_var,iVar3);
        local_a8.first.data = pvStack_b8;
        std::pair<SoundHandle,_bool>::operator=((pair<SoundHandle,_bool> *)local_78,&local_a8);
      }
      if (sfxdata_00 != (BYTE *)0x0) {
        operator_delete__(sfxdata_00);
      }
      (sfx->data3d).data = (void *)local_78;
      FWadLump::~FWadLump((FWadLump *)&sfxdata);
    }
  }
  return;
}

Assistant:

static void S_LoadSound3D(sfxinfo_t *sfx)
{
    if (GSnd->IsNull()) return;

    if(sfx->data3d.isValid())
        return;

    DPrintf(DMSG_NOTIFY, "Loading monoized sound \"%s\" (%td)\n", sfx->name.GetChars(), sfx - &S_sfx[0]);

    int size = Wads.LumpLength(sfx->lumpnum);
    if(size <= 0) return;

    FWadLump wlump = Wads.OpenLumpNum(sfx->lumpnum);
    BYTE *sfxdata = new BYTE[size];
    wlump.Read(sfxdata, size);
    SDWORD dmxlen = LittleLong(((SDWORD *)sfxdata)[1]);
    std::pair<SoundHandle,bool> snd;

    // If the sound is voc, use the custom loader.
    if (strncmp ((const char *)sfxdata, "Creative Voice File", 19) == 0)
    {
        snd = GSnd->LoadSoundVoc(sfxdata, size, true);
    }
    // If the sound is raw, just load it as such.
    else if (sfx->bLoadRAW)
    {
        snd = GSnd->LoadSoundRaw(sfxdata, size, sfx->RawRate, 1, 8, sfx->LoopStart, true);
    }
    // Otherwise, try the sound as DMX format.
    else if (((BYTE *)sfxdata)[0] == 3 && ((BYTE *)sfxdata)[1] == 0 && dmxlen <= size - 8)
    {
        int frequency = LittleShort(((WORD *)sfxdata)[1]);
        if (frequency == 0) frequency = 11025;
        snd = GSnd->LoadSoundRaw(sfxdata+8, dmxlen, frequency, 1, 8, sfx->LoopStart, -1, true);
    }
    // If that fails, let the sound system try and figure it out.
    else
    {
        snd = GSnd->LoadSound(sfxdata, size, true);
    }
    delete[] sfxdata;

    sfx->data3d = snd.first;
}